

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

void __thiscall
cmForEachFunctionBlocker::cmForEachFunctionBlocker(cmForEachFunctionBlocker *this,cmMakefile *mf)

{
  cmFunctionBlocker::cmFunctionBlocker(&this->super_cmFunctionBlocker);
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR_IsFunctionBlocked_0066d3a0;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Functions).super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Makefile = mf;
  this->Depth = 0;
  cmMakefile::PushLoopBlock(mf);
  return;
}

Assistant:

cmForEachFunctionBlocker::cmForEachFunctionBlocker(cmMakefile* mf):
  Makefile(mf), Depth(0)
{
  this->Makefile->PushLoopBlock();
}